

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManRemoveIdentical(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  ulong *puVar1;
  int Entry;
  word *pwVar2;
  int *piVar3;
  word *pwVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int local_48;
  
  uVar13 = (ulong)(uint)vGroup->nSize;
  if (vGroup->nSize < 1) {
    local_48 = 0;
  }
  else {
    lVar9 = 0;
    lVar10 = 1;
    local_48 = 0;
    do {
      iVar14 = vGroup->pArray[lVar9];
      if (iVar14 != -1) {
        uVar5 = p->nWordsIn * iVar14;
        if (((int)uVar5 < 0) || (p->vWordsIn->nSize <= (int)uVar5)) {
LAB_0033551a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (lVar9 + 1 < (long)vGroup->nSize) {
          pwVar2 = p->vWordsIn->pArray;
          lVar11 = lVar10;
          do {
            piVar3 = vGroup->pArray;
            Entry = piVar3[lVar11];
            if (Entry != -1) {
              uVar6 = p->nWordsIn * Entry;
              if (((int)uVar6 < 0) || (p->vWordsIn->nSize <= (int)uVar6)) goto LAB_0033551a;
              iVar7 = bcmp(pwVar2 + uVar5,p->vWordsIn->pArray + uVar6,(long)p->nWordsIn << 3);
              if (iVar7 == 0) {
                uVar6 = p->nWordsOut;
                uVar8 = uVar6 * iVar14;
                if ((int)uVar8 < 0) goto LAB_0033551a;
                iVar7 = p->vWordsOut->nSize;
                if (((iVar7 <= (int)uVar8) || (uVar12 = uVar6 * Entry, (int)uVar12 < 0)) ||
                   (iVar7 <= (int)uVar12)) goto LAB_0033551a;
                if (0 < (int)uVar6) {
                  pwVar4 = p->vWordsOut->pArray;
                  uVar13 = 0;
                  do {
                    puVar1 = pwVar4 + uVar8 + uVar13;
                    *puVar1 = *puVar1 | pwVar4[uVar12 + uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar6 != uVar13);
                }
                piVar3[lVar11] = -1;
                Vec_IntPush(p->vFree,Entry);
                local_48 = local_48 + 1;
              }
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 < vGroup->nSize);
        }
      }
      lVar9 = lVar9 + 1;
      uVar13 = (ulong)vGroup->nSize;
      lVar10 = lVar10 + 1;
    } while (lVar9 < (long)uVar13);
  }
  iVar14 = (int)uVar13;
  if (local_48 != 0) {
    if (iVar14 < 1) {
      uVar5 = 0;
    }
    else {
      piVar3 = vGroup->pArray;
      lVar9 = 0;
      uVar5 = 0;
      do {
        iVar14 = piVar3[lVar9];
        if (iVar14 != -1) {
          if (((int)uVar5 < 0) || ((int)uVar13 <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar13 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          piVar3[uVar13] = iVar14;
        }
        lVar9 = lVar9 + 1;
        iVar14 = vGroup->nSize;
        uVar13 = (ulong)iVar14;
      } while (lVar9 < (long)uVar13);
    }
    if (iVar14 < (int)uVar5) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vGroup->nSize = uVar5;
  }
  return local_48;
}

Assistant:

int Mop_ManRemoveIdentical( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int w, c1, c2, iCube1, iCube2, nEqual = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( memcmp(pCube1, pCube2, sizeof(word)*p->nWordsIn) )
                continue;
            // merge cubes
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            for ( w = 0; w < p->nWordsOut; w++ )
                pCube1Out[w] |= pCube2Out[w];
            Vec_IntWriteEntry( vGroup, c2, -1 );
            Vec_IntPush( p->vFree, iCube2 );
            nEqual++;
        }
    }
    if ( nEqual )
        Map_ManGroupCompact( vGroup );
    return nEqual;
}